

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_SUNMemory.cpp
# Opt level: O2

SUNMemoryHelper amrex::sundials::anon_unknown_0::CreateMemoryHelper(Context *sunctx)

{
  SUNMemoryHelper_Ops p_Var1;
  SUNMemoryHelper p_Var2;
  
  p_Var2 = SUNMemoryHelper_NewEmpty
                     (*(sunctx->sunctx_)._M_t.
                       super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>.
                       _M_t.
                       super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>.
                       super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl);
  p_Var2->content = (void *)0x0;
  p_Var1 = p_Var2->ops;
  p_Var1->clone = CloneMemoryHelper;
  p_Var1->alloc = Alloc;
  p_Var1->dealloc = Dealloc;
  p_Var1->destroy = DestroyMemoryHelper;
  return p_Var2;
}

Assistant:

SUNMemoryHelper CreateMemoryHelper(::sundials::Context* sunctx)
    {
        SUNMemoryHelper helper;

        helper = SUNMemoryHelper_NewEmpty(*sunctx);

        helper->content          = NULL;
        helper->ops->clone       = CloneMemoryHelper;
        helper->ops->alloc       = Alloc;
        helper->ops->dealloc     = Dealloc;
        helper->ops->destroy     = DestroyMemoryHelper;
#if defined(AMREX_USE_HIP)
        helper->ops->copy      = SUNMemoryHelper_Copy_Hip;
        helper->ops->copyasync = SUNMemoryHelper_CopyAsync_Hip;
#elif defined(AMREX_USE_CUDA)
        helper->ops->copy      = SUNMemoryHelper_Copy_Cuda;
        helper->ops->copyasync = SUNMemoryHelper_CopyAsync_Cuda;
#elif defined(AMREX_USE_DPCPP)
        helper->ops->copy      = SUNMemoryHelper_Copy_Sycl;
        helper->ops->copyasync = SUNMemoryHelper_CopyAsync_Sycl;
#endif

        return helper;
    }